

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetShaderStagesString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderStages)

{
  SHADER_TYPE b;
  long lVar1;
  Char *pCVar2;
  char (*in_RCX) [18];
  undefined1 local_50 [8];
  string msg;
  SHADER_TYPE local_1c;
  Uint32 Stage;
  String *pSStack_10;
  SHADER_TYPE ShaderStages_local;
  String *StagesStr;
  
  Stage = (Uint32)this;
  pSStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_1c = SHADER_TYPE_VERTEX; Stage != 0 && local_1c < (SHADER_TYPE_LAST|SHADER_TYPE_VERTEX)
      ; local_1c = local_1c << 1) {
    if ((Stage & local_1c) != SHADER_TYPE_UNKNOWN) {
      lVar1 = std::__cxx11::string::length();
      if (lVar1 != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      pCVar2 = GetShaderTypeLiteralName(local_1c);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
      b = operator~((Diligent *)(ulong)local_1c,(SHADER_TYPE)pCVar2);
      operator&=(&Stage,b);
    }
  }
  if (Stage != 0) {
    FormatString<char[26],char[18]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderStages == 0",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetShaderStagesString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x336);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetShaderStagesString(SHADER_TYPE ShaderStages)
{
    String StagesStr;
    for (Uint32 Stage = SHADER_TYPE_VERTEX; ShaderStages != 0 && Stage <= SHADER_TYPE_LAST; Stage <<= 1)
    {
        if (ShaderStages & Stage)
        {
            if (StagesStr.length())
                StagesStr += ", ";
            StagesStr += GetShaderTypeLiteralName(static_cast<SHADER_TYPE>(Stage));
            ShaderStages &= ~static_cast<SHADER_TYPE>(Stage);
        }
    }
    VERIFY_EXPR(ShaderStages == 0);
    return StagesStr;
}